

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

bool __thiscall
QListWidget::dropMimeData(QListWidget *this,int index,QMimeData *data,DropAction action)

{
  undefined1 uVar1;
  DropIndicatorPosition DVar2;
  QAbstractItemModel *pQVar3;
  QMimeData *pQVar4;
  QModelIndex *pQVar5;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xffffffffffffffff;
  uStack_40 = 0;
  local_38 = 0;
  DVar2 = QAbstractItemView::dropIndicatorPosition((QAbstractItemView *)this);
  pQVar5 = (QModelIndex *)0x0;
  if (DVar2 == OnItem) {
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_48,pQVar3,index,0);
    index = -1;
    pQVar5 = (QModelIndex *)0xffffffff;
  }
  pQVar4 = (QMimeData *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  uVar1 = QAbstractListModel::dropMimeData(pQVar4,(DropAction)data,action,index,pQVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QListWidget::dropMimeData(int index, const QMimeData *data, Qt::DropAction action)
{
    QModelIndex idx;
    int row = index;
    int column = 0;
    if (dropIndicatorPosition() == QAbstractItemView::OnItem) {
        // QAbstractListModel::dropMimeData will overwrite on the index if row == -1 and column == -1
        idx = model()->index(row, column);
        row = -1;
        column = -1;
    }
    return d_func()->listModel()->QAbstractListModel::dropMimeData(data, action , row, column, idx);
}